

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  uint local_44;
  uint local_40;
  int local_3c;
  j_decompress_ptr in_stack_ffffffffffffffd0;
  uchar *st_00;
  j_decompress_ptr cinfo_00;
  
  cinfo_00 = (j_decompress_ptr)in_RDI[0x4a];
  if ((int)in_RDI[0x2e] != 0) {
    if (*(int *)&cinfo_00->field_0x4c == 0) {
      process_restart(in_stack_ffffffffffffffd0);
    }
    *(int *)&cinfo_00->field_0x4c = *(int *)&cinfo_00->field_0x4c + -1;
  }
  if (*(int *)&cinfo_00->src != -1) {
    st_00 = (uchar *)*in_RSI;
    local_3c = *(int *)((long)in_RDI + 0x20c);
    while ((local_3c <= (int)in_RDI[0x42] && (iVar1 = arith_decode(cinfo_00,st_00), iVar1 == 0))) {
      while (iVar1 = arith_decode(cinfo_00,st_00), iVar1 == 0) {
        local_3c = local_3c + 1;
        if ((int)in_RDI[0x42] < local_3c) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
          (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
          *(undefined4 *)&cinfo_00->src = 0xffffffff;
          return 1;
        }
      }
      iVar1 = arith_decode(cinfo_00,st_00);
      local_44 = arith_decode(cinfo_00,st_00);
      if ((local_44 != 0) && (iVar2 = arith_decode(cinfo_00,st_00), iVar2 != 0)) {
        local_44 = local_44 << 1;
        while (iVar2 = arith_decode(cinfo_00,st_00), iVar2 != 0) {
          local_44 = local_44 << 1;
          if (local_44 == 0x8000) {
            *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
            (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
            *(undefined4 *)&cinfo_00->src = 0xffffffff;
            return 1;
          }
        }
      }
      local_40 = local_44;
      while (local_44 = (int)local_44 >> 1, local_44 != 0) {
        iVar2 = arith_decode(cinfo_00,st_00);
        if (iVar2 != 0) {
          local_40 = local_44 | local_40;
        }
      }
      local_40 = local_40 + 1;
      if (iVar1 != 0) {
        local_40 = -local_40;
      }
      *(short *)(st_00 + (long)jpeg_natural_order[local_3c] * 2) =
           (short)(local_40 << ((byte)(int)in_RDI[0x43] & 0x1f));
      local_3c = local_3c + 1;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;         /* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1;  if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[jpeg_natural_order[k]] = (JCOEF)((unsigned)v << cinfo->Al);
  }

  return TRUE;
}